

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlSplitQName3(xmlChar *name,int *len)

{
  xmlChar *pxVar1;
  int iVar2;
  
  if ((len != (int *)0x0 && name != (xmlChar *)0x0) && (iVar2 = 0, *name != ':')) {
    for (pxVar1 = name + 1; pxVar1[-1] != '\0'; pxVar1 = pxVar1 + 1) {
      if (pxVar1[-1] == ':') {
        *len = iVar2;
        return pxVar1;
      }
      iVar2 = iVar2 + 1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlSplitQName3(const xmlChar *name, int *len) {
    int l = 0;

    if (name == NULL) return(NULL);
    if (len == NULL) return(NULL);

    /* nasty but valid */
    if (name[0] == ':')
	return(NULL);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    if (name[l] == 0)
	return(NULL);

    *len = l;

    return(&name[l+1]);
}